

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O2

MXFWriter * __thiscall
AS_02::PCM::MXFWriter::OpenWrite
          (MXFWriter *this,string *filename,WriterInfo *Info,FileDescriptor *essence_descriptor,
          InterchangeObject_list_t *essence_sub_descriptor_list,Rational *edit_rate,
          ui32_t header_size)

{
  ILogSink *pIVar1;
  h__Writer *this_00;
  Dictionary *d;
  undefined1 *puVar2;
  
  if (essence_sub_descriptor_list == (InterchangeObject_list_t *)0x0) {
    pIVar1 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar1,"Essence descriptor object required.\n");
    puVar2 = Kumu::RESULT_PARAM;
  }
  else {
    if (essence_descriptor[0x40] != (FileDescriptor)0x1) {
      this_00 = (h__Writer *)operator_new(0x5e0);
      d = (Dictionary *)ASDCP::DefaultSMPTEDict();
      h__Writer::h__Writer(this_00,d);
      if ((long *)filename->_M_string_length != (long *)0x0) {
        (**(code **)(*(long *)filename->_M_string_length + 8))();
      }
      filename->_M_string_length = (size_type)this_00;
      ASDCP::WriterInfo::operator=
                (&(this_00->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                  super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                  super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_Info,
                 (WriterInfo *)essence_descriptor);
      h__Writer::OpenWrite
                ((h__Writer *)this,(string *)filename->_M_string_length,(FileDescriptor *)Info,
                 essence_sub_descriptor_list,(ui32_t *)edit_rate);
      if (-1 < *(int *)&this->_vptr_MXFWriter) {
        h__Writer::SetSourceStream
                  ((h__Writer *)&stack0xffffffffffffff68,(Rational *)filename->_M_string_length);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
        Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
        if (-1 < *(int *)&this->_vptr_MXFWriter) {
          return this;
        }
      }
      filename->_M_string_length = 0;
      return this;
    }
    pIVar1 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar1,"Encryption not supported for ST 382 clip-wrap.\n");
    puVar2 = Kumu::RESULT_NOTIMPL;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar2);
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFWriter::OpenWrite(const std::string& filename, const WriterInfo& Info,
				 ASDCP::MXF::FileDescriptor* essence_descriptor,
				 ASDCP::MXF::InterchangeObject_list_t& essence_sub_descriptor_list,
				 const ASDCP::Rational& edit_rate, ui32_t header_size)
{
  if ( essence_descriptor == 0 )
    {
      DefaultLogSink().Error("Essence descriptor object required.\n");
      return RESULT_PARAM;
    }

  if ( Info.EncryptedEssence )
    {
      DefaultLogSink().Error("Encryption not supported for ST 382 clip-wrap.\n");
      return Kumu::RESULT_NOTIMPL;
    }

  m_Writer = new h__Writer(&DefaultSMPTEDict());
  m_Writer->m_Info = Info;

  Result_t result = m_Writer->OpenWrite(filename, essence_descriptor, essence_sub_descriptor_list, header_size);

  if ( KM_SUCCESS(result) )
    result = m_Writer->SetSourceStream(edit_rate);

  if ( ASDCP_FAILURE(result) )
    m_Writer.release();

  return result;
}